

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O1

send_result_t
zmq::send_multipart<std::initializer_list<zmq::const_buffer>,void>
          (socket_ref s,initializer_list<zmq::const_buffer> *msgs,send_flags flags)

{
  _Storage<unsigned_long,_true> _Var1;
  _Storage<unsigned_long,_true> _Var2;
  undefined4 in_register_00000014;
  ulong uVar3;
  ulong extraout_RDX;
  undefined8 uVar4;
  iterator pcVar5;
  int in_R8D;
  iterator pcVar6;
  send_result_t sVar7;
  socket_base local_38;
  
  uVar3 = CONCAT44(in_register_00000014,flags);
  pcVar5 = msgs->_M_array;
  pcVar6 = pcVar5 + msgs->_M_len;
  _Var2._M_value = 0;
  local_38 = s.super_socket_base._handle;
  do {
    _Var1 = _Var2;
    if (pcVar5 == pcVar6) {
      uVar4 = CONCAT71((int7)(uVar3 >> 8),1);
      goto LAB_00149aa9;
    }
    detail::socket_base::send
              (&local_38,(int)pcVar5->_data,(void *)pcVar5->_size,
               (ulong)((uint)(pcVar5 + 1 != pcVar6) * 2 | flags),in_R8D);
    if ((extraout_RDX & 1) == 0) {
      _Var2 = _Var1;
      if (pcVar5 != msgs->_M_array) {
        __assert_fail("it == begin(msgs)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq_addon.hpp"
                      ,0xf1,
                      "send_result_t zmq::send_multipart(socket_ref, Range &&, send_flags) [Range = std::initializer_list<zmq::const_buffer>]"
                     );
      }
    }
    else {
      _Var2._M_value = _Var1._M_value + 1;
      pcVar5 = pcVar5 + 1;
    }
    uVar3 = extraout_RDX;
  } while ((extraout_RDX & 1) != 0);
  uVar4 = 0;
LAB_00149aa9:
  sVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar4;
  sVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var1._M_value;
  return (send_result_t)
         sVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

send_result_t
send_multipart(socket_ref s, Range &&msgs, send_flags flags = send_flags::none)
{
    using std::begin;
    using std::end;
    auto it = begin(msgs);
    const auto end_it = end(msgs);
    size_t msg_count = 0;
    while (it != end_it) {
        const auto next = std::next(it);
        const auto msg_flags =
          flags | (next == end_it ? send_flags::none : send_flags::sndmore);
        if (!s.send(*it, msg_flags)) {
            // zmq ensures atomic delivery of messages
            assert(it == begin(msgs));
            return {};
        }
        ++msg_count;
        it = next;
    }
    return msg_count;
}